

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

MinBroadcastableLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_minbroadcastable
          (NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  MinBroadcastableLayerParams *pMVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_minbroadcastable(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_minbroadcastable(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pMVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::MinBroadcastableLayerParams>(arena);
    (this->layer_).minbroadcastable_ = pMVar2;
  }
  return (MinBroadcastableLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::MinBroadcastableLayerParams* NeuralNetworkLayer::_internal_mutable_minbroadcastable() {
  if (!_internal_has_minbroadcastable()) {
    clear_layer();
    set_has_minbroadcastable();
    layer_.minbroadcastable_ = CreateMaybeMessage< ::CoreML::Specification::MinBroadcastableLayerParams >(GetArenaForAllocation());
  }
  return layer_.minbroadcastable_;
}